

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txorphanage.cpp
# Opt level: O2

void __thiscall TxOrphanage::LimitOrphans(TxOrphanage *this,uint max_orphans,FastRandomContext *rng)

{
  size_t sVar1;
  bool bVar2;
  int iVar3;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> tVar4;
  TxOrphanage *pTVar5;
  unsigned_long uVar6;
  uint uVar7;
  size_t sVar8;
  char *wtxid;
  TxOrphanage *category;
  TxOrphanage *pTVar9;
  _Self __tmp;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  int local_50;
  int local_40;
  uint nEvicted;
  long local_38;
  
  wtxid = (char *)(ulong)max_orphans;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  nEvicted = 0;
  category = this;
  tVar4 = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
  if ((this->m_next_sweep).__d.__r <= (long)tVar4.__d.__r) {
    local_50 = 0;
    sVar8 = (long)tVar4.__d.__r + 900;
    pTVar9 = (TxOrphanage *)(this->m_orphans)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while (pTVar9 != (TxOrphanage *)&(this->m_orphans)._M_t._M_impl.super__Rb_tree_header) {
      category = pTVar9;
      pTVar5 = (TxOrphanage *)std::_Rb_tree_increment((_Rb_tree_node_base *)pTVar9);
      sVar1 = (pTVar9->m_peer_work_set)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      if ((long)tVar4.__d.__r < (long)sVar1) {
        pTVar9 = pTVar5;
        if ((long)sVar1 <= (long)sVar8) {
          sVar8 = sVar1;
        }
      }
      else {
        wtxid = (char *)((long)&(pTVar9->m_peer_work_set)._M_t._M_impl.super__Rb_tree_header.
                                _M_header._M_parent[2]._M_right + 1);
        category = this;
        iVar3 = EraseTx(this,(Wtxid *)wtxid);
        local_50 = local_50 + iVar3;
        pTVar9 = pTVar5;
      }
    }
    local_40 = local_50;
    (this->m_next_sweep).__d.__r = sVar8 + 300;
    if ((local_50 != 0) && (bVar2 = ::LogAcceptCategory((LogFlags)category,(Level)wtxid), bVar2)) {
      category = (TxOrphanage *)0xc;
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/txorphanage.cpp"
      ;
      source_file._M_len = 0x5f;
      logging_function._M_str = "LimitOrphans";
      logging_function._M_len = 0xc;
      wtxid = "LimitOrphans";
      LogPrintFormatInternal<int>
                (logging_function,source_file,0x78,TXPACKAGES,Debug,
                 (ConstevalFormatString<1U>)0x6c28d7,&local_40);
    }
  }
  uVar7 = 1;
  while ((ulong)max_orphans < (this->m_orphans)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    uVar6 = RandomMixin<FastRandomContext>::randrange<unsigned_long>
                      (&rng->super_RandomMixin<FastRandomContext>,
                       (long)(this->m_orphan_list).
                             super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_orphan_list).
                             super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3);
    wtxid = (char *)(*(long *)((this->m_orphan_list).
                               super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar6]._M_node + 2) + 0x59)
    ;
    category = this;
    EraseTx(this,(Wtxid *)wtxid);
    nEvicted = uVar7;
    uVar7 = uVar7 + 1;
  }
  if ((uVar7 != 1) && (bVar2 = ::LogAcceptCategory((LogFlags)category,(Level)wtxid), bVar2)) {
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/txorphanage.cpp"
    ;
    source_file_00._M_len = 0x5f;
    logging_function_00._M_str = "LimitOrphans";
    logging_function_00._M_len = 0xc;
    LogPrintFormatInternal<unsigned_int>
              (logging_function_00,source_file_00,0x81,TXPACKAGES,Debug,
               (ConstevalFormatString<1U>)0x6c28fe,&nEvicted);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void TxOrphanage::LimitOrphans(unsigned int max_orphans, FastRandomContext& rng)
{
    unsigned int nEvicted = 0;
    auto nNow{Now<NodeSeconds>()};
    if (m_next_sweep <= nNow) {
        // Sweep out expired orphan pool entries:
        int nErased = 0;
        auto nMinExpTime{nNow + ORPHAN_TX_EXPIRE_TIME - ORPHAN_TX_EXPIRE_INTERVAL};
        std::map<Wtxid, OrphanTx>::iterator iter = m_orphans.begin();
        while (iter != m_orphans.end())
        {
            std::map<Wtxid, OrphanTx>::iterator maybeErase = iter++;
            if (maybeErase->second.nTimeExpire <= nNow) {
                nErased += EraseTx(maybeErase->second.tx->GetWitnessHash());
            } else {
                nMinExpTime = std::min(maybeErase->second.nTimeExpire, nMinExpTime);
            }
        }
        // Sweep again 5 minutes after the next entry that expires in order to batch the linear scan.
        m_next_sweep = nMinExpTime + ORPHAN_TX_EXPIRE_INTERVAL;
        if (nErased > 0) LogDebug(BCLog::TXPACKAGES, "Erased %d orphan tx due to expiration\n", nErased);
    }
    while (m_orphans.size() > max_orphans)
    {
        // Evict a random orphan:
        size_t randompos = rng.randrange(m_orphan_list.size());
        EraseTx(m_orphan_list[randompos]->second.tx->GetWitnessHash());
        ++nEvicted;
    }
    if (nEvicted > 0) LogDebug(BCLog::TXPACKAGES, "orphanage overflow, removed %u tx\n", nEvicted);
}